

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_send.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  __useconds_t __value;
  size_t interval;
  size_t frequency;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    fprintf(_stderr,"usage: ./meassure_send [FREQUENCY]\n");
    exit(1);
  }
  uVar3 = strtoll(argv[1],(char **)0x0,10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  auVar2 = ZEXT816(0) << 0x40 | ZEXT816(1000000);
  printf("Sending alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n",uVar3,
         SUB168(auVar2 % auVar1,0));
  signal(0xe,signal_handler);
  __value = SUB164(auVar2 / auVar1,0);
  ualarm(__value,__value);
  do {
    while ((counter & 1) != 0) {
      maccess((void *)0x105080);
    }
    flush((void *)0x105080);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    size_t frequency, interval;
    if(argc == 2)
    {
        frequency = strtoll(argv[1], NULL, 10);
        // interval in usecs
        interval = 1000000/frequency;
    }
    else
    {
        fprintf(stderr, "usage: ./meassure_send [FREQUENCY]\n");
        exit(1);
    }
    printf("Sending alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n",
           frequency);


    signal(SIGALRM, signal_handler);

    ualarm(interval, interval);

    loop:

    while(1)
    {
        if(counter % 2)
        {
            maccess(function + 64);
        }
        else
        {
            flush(function + 64);
        }
    }

    goto loop;

}